

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O3

int fileIn(FILE *fp)

{
  uint8_t uVar1;
  int iVar2;
  object **ppoVar3;
  object *poVar4;
  object *poVar5;
  object *poVar6;
  int64_t iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  byteObject *bobj;
  size_t __n;
  object *imageBase;
  object *imageTop;
  object *imagePointer;
  int local_50;
  undefined4 uStack_4c;
  int64_t local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  uVar1 = get_image_version(fp);
  switch(uVar1) {
  case '\0':
    fileIn_cold_2();
    iVar2 = local_50;
    break;
  case '\x01':
    fileIn_cold_1();
    iVar2 = local_50;
    break;
  case '\x02':
    info_impl("fileIn",0x6d,"Reading in version 2 image.");
    fread(&local_50,8,1,(FILE *)fp);
    fprintf(_stderr,"Read in image imageBase=%p\n");
    fread(&local_38,8,1,(FILE *)fp);
    fprintf(_stderr,"Read in image imagePointer=%p\n",local_38);
    fread(&local_40,8,1,(FILE *)fp);
    fprintf(_stderr,"Read in image imageTop=%p\n",local_40);
    iVar13 = (int)local_40 - (int)local_38;
    iVar2 = iVar13 + 7;
    if (-1 < iVar13) {
      iVar2 = iVar13;
    }
    iVar2 = iVar2 >> 3;
    __n = (size_t)iVar2;
    fprintf(_stderr,"Image has %ld cells.\n",__n);
    fprintf(_stderr,"memoryBase is %p\n",memoryBase);
    fprintf(_stderr,"memoryPointer is %p\n",memoryPointer);
    fprintf(_stderr,"memoryTop is %p\n",memoryTop);
    lVar12 = (long)memoryBase - CONCAT44(uStack_4c,local_50);
    fprintf(_stderr,"Address offset between image and current memory pointer is %ld bytes.\n",lVar12
           );
    lVar10 = lVar12 + 7;
    if (-1 < lVar12) {
      lVar10 = lVar12;
    }
    lVar10 = lVar10 >> 3;
    fprintf(_stderr,"Address offset between image and current memory pointer is %ld cells.\n",lVar10
           );
    memoryPointer = (object *)((long)memoryTop + __n * -8);
    fread(&globalsObject,8,1,(FILE *)fp);
    globalsObject = fix_offset(globalsObject,lVar10);
    addStaticRoot(&globalsObject);
    fprintf(_stderr,"Read in globals object=%p\n",globalsObject);
    fread(&initialMethod,8,1,(FILE *)fp);
    initialMethod = fix_offset(initialMethod,lVar10);
    addStaticRoot(&initialMethod);
    fprintf(_stderr,"Read in initial method=%p\n",initialMethod);
    fwrite("Reading binary message objects.\n",0x20,1,_stderr);
    uVar8 = 0;
    lVar12 = 0;
    do {
      fread((object **)((long)binaryMessages + lVar12),8,1,(FILE *)fp);
      poVar4 = fix_offset(*(object **)((long)binaryMessages + lVar12),lVar10);
      *(object **)((long)binaryMessages + lVar12) = poVar4;
      addStaticRoot((object **)((long)binaryMessages + lVar12));
      fprintf(_stderr,"  Read in binary message %d=%p\n",uVar8,
              *(undefined8 *)((long)binaryMessages + lVar12));
      lVar12 = lVar12 + 8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (lVar12 != 0x18);
    fread(&badMethodSym,8,1,(FILE *)fp);
    badMethodSym = fix_offset(badMethodSym,lVar10);
    addStaticRoot(&badMethodSym);
    fprintf(_stderr,"Read in doesNotUnderstand: symbol=%p\n",badMethodSym);
    fread(memoryPointer,8,__n,(FILE *)fp);
    local_48 = time_usec();
    poVar4 = memoryPointer;
    if (memoryPointer < memoryTop) {
      do {
        if (poVar4 == (object *)0x0) {
          error_impl("object_fix_up",0x3d1,"Fixing up a null object!");
        }
        uVar8 = poVar4->header;
        uVar11 = (uint)(uVar8 >> 2) & 0x3fffffff;
        poVar5 = fix_offset(poVar4->class,lVar10);
        poVar4->class = poVar5;
        if ((uVar8 & 2) == 0) {
          if (3 < (uint)uVar8) {
            uVar9 = 0;
            do {
              poVar5 = (object *)(&poVar4[1].header)[uVar9];
              poVar6 = nilObject;
              if (poVar5 == (object *)0x0) {
LAB_0010777f:
                (&poVar4[1].header)[uVar9] = (uintptr_t)poVar6;
              }
              else if (((ulong)poVar5 & 1) == 0) {
                poVar6 = fix_offset(poVar5,lVar10);
                goto LAB_0010777f;
              }
              uVar9 = uVar9 + 1;
            } while (uVar11 + ((uVar8 >> 2 & 0x3fffffff) == 0) != uVar9);
          }
        }
        else {
          uVar11 = uVar11 + 7 >> 3;
        }
        poVar4 = (object *)((long)&poVar4->header + (ulong)(uVar11 * 8 + 0x10));
      } while (poVar4 < memoryTop);
    }
    iVar7 = time_usec();
    nilObject = lookupGlobal("nil");
    addStaticRoot(&nilObject);
    trueObject = lookupGlobal("true");
    addStaticRoot(&trueObject);
    falseObject = lookupGlobal("false");
    addStaticRoot(&falseObject);
    ArrayClass = lookupGlobal("Array");
    addStaticRoot(&ArrayClass);
    BlockClass = lookupGlobal("Block");
    addStaticRoot(&BlockClass);
    ByteArrayClass = lookupGlobal("ByteArray");
    addStaticRoot(&ByteArrayClass);
    ContextClass = lookupGlobal("Context");
    addStaticRoot(&ContextClass);
    DictionaryClass = lookupGlobal("Dictionary");
    addStaticRoot(&DictionaryClass);
    IntegerClass = lookupGlobal("Integer");
    addStaticRoot(&IntegerClass);
    SmallIntClass = lookupGlobal("SmallInt");
    addStaticRoot(&SmallIntClass);
    StringClass = lookupGlobal("String");
    addStaticRoot(&StringClass);
    SymbolClass = lookupGlobal("Symbol");
    addStaticRoot(&SymbolClass);
    UndefinedClass = lookupGlobal("Undefined");
    addStaticRoot(&UndefinedClass);
    fprintf(_stderr,"Object fix up took %d usec.\n",(ulong)(uint)((int)iVar7 - (int)local_48));
    fprintf(_stderr,"Read in %ld cells.\n",__n);
    break;
  case '\x03':
    info_impl("fileIn",0x72,"Reading in version 3 image.");
    if (inSpaceOne == 0) {
      ppoVar3 = &spaceOne;
    }
    else {
      ppoVar3 = &spaceTwo;
    }
    indirArray = (object **)*ppoVar3;
    indirtop = 0;
    info_impl("fileIn_version_3",0x156,"reading globals object.");
    globalsObject = objectRead(fp);
    addStaticRoot(&globalsObject);
    if (debugging != 0) {
      printf("Globals: ");
      dumpDictKeys(globalsObject);
      putchar(10);
    }
    info_impl("fileIn_version_3",0x161,"Finding special symbols.");
    poVar4 = lookupGlobal("specialSymbols");
    binaryMessages[0] = (object *)poVar4[1].header;
    addStaticRoot(binaryMessages);
    binaryMessages[1] = poVar4[1].class;
    addStaticRoot(binaryMessages + 1);
    binaryMessages[2] = (object *)poVar4[2].header;
    addStaticRoot(binaryMessages + 2);
    badMethodSym = poVar4[2].class;
    addStaticRoot(&badMethodSym);
    nilObject = lookupGlobal("nil");
    addStaticRoot(&nilObject);
    trueObject = lookupGlobal("true");
    addStaticRoot(&trueObject);
    falseObject = lookupGlobal("false");
    addStaticRoot(&falseObject);
    ArrayClass = lookupGlobal("Array");
    addStaticRoot(&ArrayClass);
    BlockClass = lookupGlobal("Block");
    addStaticRoot(&BlockClass);
    ByteArrayClass = lookupGlobal("ByteArray");
    addStaticRoot(&ByteArrayClass);
    ContextClass = lookupGlobal("Context");
    addStaticRoot(&ContextClass);
    DictionaryClass = lookupGlobal("Dictionary");
    addStaticRoot(&DictionaryClass);
    IntegerClass = lookupGlobal("Integer");
    addStaticRoot(&IntegerClass);
    SmallIntClass = lookupGlobal("SmallInt");
    addStaticRoot(&SmallIntClass);
    StringClass = lookupGlobal("String");
    addStaticRoot(&StringClass);
    SymbolClass = lookupGlobal("Symbol");
    addStaticRoot(&SymbolClass);
    UndefinedClass = lookupGlobal("Undefined");
    addStaticRoot(&UndefinedClass);
    info_impl("fileIn_version_3",0x198,"Memory top %p",memoryTop);
    info_impl("fileIn_version_3",0x199,"Memory pointer %p",memoryPointer);
    info_impl("fileIn_version_3",0x19b,"Read in %d objects.",(ulong)(uint)indirtop);
    iVar2 = indirtop;
    break;
  default:
    error_impl("fileIn",0x77,"Unsupported image file version: %u.");
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int fileIn(FILE *fp)
{
    uint8_t version = get_image_version(fp);

    switch(version) {
    case IMAGE_VERSION_0:
        info("Reading in version 0 image.");
        return fileIn_version_0(fp);
        break;

    case IMAGE_VERSION_1:
        info("Reading in version 1 image.");
        return fileIn_version_1(fp);
        break;

    case IMAGE_VERSION_2:
        info("Reading in version 2 image.");
        return fileIn_version_2(fp);
        break;

    case IMAGE_VERSION_3:
        info("Reading in version 3 image.");
        return fileIn_version_3(fp);
        break;

    default:
        error("Unsupported image file version: %u.", version);
        break;
    }

    return 0;
}